

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O0

ISPCCamera * __thiscall embree::Camera::getISPCCamera(Camera *this,size_t width,size_t height)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ulong in_RCX;
  ulong in_RDX;
  long in_RSI;
  ISPCCamera *in_RDI;
  Vec3fa p;
  Vec3fa vz;
  Vec3fa vy;
  Vec3fa vx;
  AffineSpace3fa local2world;
  float fovScale;
  __m128 mask;
  float local_604;
  float local_5f4;
  undefined4 in_stack_fffffffffffffa40;
  undefined4 in_stack_fffffffffffffa44;
  float local_5b8;
  undefined4 local_5b4;
  undefined4 local_5b0;
  float local_5ac;
  undefined4 local_5a8;
  float local_5a0;
  undefined4 local_59c;
  float local_594;
  float local_590;
  float local_58c;
  anon_union_12_2_4062524c_for_Vec3<float>_1 local_588;
  anon_union_12_2_4062524c_for_Vec3<float>_1 local_57c;
  undefined1 local_570 [12];
  anon_union_12_2_4062524c_for_Vec3<float>_1 local_564;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  ulong uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  ulong local_4c8;
  ulong uStack_4c0;
  undefined1 local_4b8 [16];
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  float local_498;
  float local_494;
  ulong local_490;
  ulong local_488;
  float *local_470;
  undefined8 *local_468;
  undefined8 *local_460;
  undefined8 *local_458;
  undefined8 *local_450;
  undefined8 local_448;
  undefined8 uStack_440;
  ulong *local_438;
  undefined8 *local_430;
  undefined8 *local_428;
  undefined8 *local_420;
  undefined8 *local_418;
  undefined8 *local_410;
  undefined8 *local_408;
  undefined8 *local_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined1 *local_3e0;
  float local_3d4;
  undefined8 *local_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  ulong *local_3b0;
  float local_3a4;
  undefined8 *local_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 *local_380;
  float local_374;
  undefined8 *local_370;
  undefined8 *local_368;
  float *local_360;
  undefined8 *local_358;
  float *local_350;
  undefined8 *local_348;
  float *local_340;
  undefined8 *local_338;
  float *local_330;
  float *local_328;
  float *local_320;
  float *local_318;
  float *local_310;
  anon_union_12_2_4062524c_for_Vec3<float>_1 *local_308;
  undefined8 *local_300;
  undefined8 *local_2f8;
  undefined8 *local_2f0;
  ulong *local_2e8;
  undefined8 *local_2e0;
  undefined8 *local_2d8;
  undefined1 *local_2d0;
  undefined8 *local_2c8;
  undefined8 *local_2c0;
  float local_2b4;
  undefined8 *local_2b0;
  float local_2a4;
  undefined8 *local_2a0;
  float local_294;
  undefined8 *local_290;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined8 local_278;
  undefined8 uStack_270;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  undefined8 local_258;
  undefined8 uStack_250;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  undefined8 local_238;
  undefined8 uStack_230;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  undefined8 *local_210;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined8 *local_1f0;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  undefined8 *local_1d0;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  undefined8 *local_1b0;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined8 *local_190;
  ulong local_188;
  ulong uStack_180;
  undefined8 *local_170;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined4 local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined4 local_70;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  float *local_60;
  float *local_58;
  float *local_50;
  anon_union_12_2_4062524c_for_Vec3<float>_1 *local_48;
  float *local_40;
  undefined1 *local_38;
  float *local_30;
  anon_union_12_2_4062524c_for_Vec3<float>_1 *local_28;
  float *local_20;
  anon_union_12_2_4062524c_for_Vec3<float>_1 *local_18;
  float *local_10;
  anon_union_12_2_4062524c_for_Vec3<float>_1 *local_8;
  
  uVar3 = local_4f8;
  local_498 = *(float *)(in_RSI + 0x30) * 0.5;
  local_470 = &local_498;
  local_490 = in_RCX;
  local_488 = in_RDX;
  local_494 = tanf(local_498 * 0.017453292);
  local_494 = 1.0 / local_494;
  camera2world((Camera *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40));
  local_460 = &local_4e8;
  local_4e8 = local_4d8;
  uStack_4e0 = uStack_4d0;
  local_438 = &local_4c8;
  local_430 = &local_4f8;
  local_ac = 0x80000000;
  local_64 = 0x80000000;
  local_68 = 0x80000000;
  local_6c = 0x80000000;
  local_70 = 0x80000000;
  local_448 = 0x8000000080000000;
  uStack_440 = 0x8000000080000000;
  local_188 = local_4c8 ^ 0x8000000080000000;
  uStack_180 = uStack_4c0 ^ 0x8000000080000000;
  local_374 = (float)local_488 * -0.5;
  local_408 = &local_528;
  local_2f8 = &local_398;
  local_238 = CONCAT44(local_374,local_374);
  uStack_230 = CONCAT44(local_374,local_374);
  local_248 = (float)local_4d8;
  fStack_244 = (float)((ulong)local_4d8 >> 0x20);
  fStack_240 = (float)uStack_4d0;
  fStack_23c = (float)((ulong)uStack_4d0 >> 0x20);
  local_1e8 = local_374 * local_248;
  fStack_1e4 = local_374 * fStack_244;
  fStack_1e0 = local_374 * fStack_240;
  fStack_1dc = local_374 * fStack_23c;
  local_e8 = CONCAT44(fStack_1e4,local_1e8);
  uStack_e0 = CONCAT44(fStack_1dc,fStack_1e0);
  local_5f4 = (float)local_490;
  local_3a4 = local_5f4 * 0.5;
  local_410 = &local_538;
  local_2e0 = &local_3c8;
  local_258 = CONCAT44(local_3a4,local_3a4);
  uStack_250 = CONCAT44(local_3a4,local_3a4);
  local_268 = (float)local_4c8;
  fStack_264 = (float)(local_4c8 >> 0x20);
  fStack_260 = (float)uStack_4c0;
  fStack_25c = (float)(uStack_4c0 >> 0x20);
  local_208 = local_3a4 * local_268;
  fStack_204 = local_3a4 * fStack_264;
  fStack_200 = local_3a4 * fStack_260;
  fStack_1fc = local_3a4 * fStack_25c;
  local_f8 = CONCAT44(fStack_204,local_208);
  uStack_f0 = CONCAT44(fStack_1fc,fStack_200);
  local_400 = &local_518;
  local_1c8 = local_1e8 + local_208;
  fStack_1c4 = fStack_1e4 + fStack_204;
  fStack_1c0 = fStack_1e0 + fStack_200;
  fStack_1bc = fStack_1dc + fStack_1fc;
  local_c8 = CONCAT44(fStack_1c4,local_1c8);
  uStack_c0 = CONCAT44(fStack_1bc,fStack_1c0);
  local_604 = (float)local_490;
  local_3d4 = local_604 * 0.5 * local_494;
  local_3e0 = local_4b8;
  local_3d0 = &local_548;
  local_290 = &local_3f8;
  local_278 = CONCAT44(local_3d4,local_3d4);
  uStack_270 = CONCAT44(local_3d4,local_3d4);
  local_2c0 = &local_548;
  local_2c8 = &local_3f8;
  local_288 = (float)local_4b8._0_8_;
  fStack_284 = SUB84(local_4b8._0_8_,4);
  fStack_280 = (float)local_4b8._8_8_;
  fStack_27c = SUB84(local_4b8._8_8_,4);
  local_228 = local_3d4 * local_288;
  fStack_224 = local_3d4 * fStack_284;
  fStack_220 = local_3d4 * fStack_280;
  fStack_21c = local_3d4 * fStack_27c;
  local_210 = &local_548;
  local_d8 = CONCAT44(fStack_224,local_228);
  uStack_d0 = CONCAT44(fStack_21c,fStack_220);
  local_418 = &local_508;
  local_420 = &local_518;
  local_428 = &local_548;
  local_1a8 = local_1c8 + local_228;
  fStack_1a4 = fStack_1c4 + fStack_224;
  fStack_1a0 = fStack_1c0 + fStack_220;
  fStack_19c = fStack_1bc + fStack_21c;
  local_190 = &local_508;
  uStack_500 = CONCAT44(fStack_19c,fStack_1a0);
  local_458 = &local_4a8;
  local_450 = &local_558;
  local_558 = local_4a8;
  uVar1 = local_558;
  uStack_550 = uStack_4a0;
  uVar2 = uStack_550;
  local_360 = &local_594;
  local_368 = &local_4e8;
  local_594 = local_248;
  local_590 = fStack_244;
  local_58c = fStack_240;
  local_350 = &local_5a0;
  local_358 = &local_4f8;
  local_4f8._0_4_ = (float)local_188;
  local_5a0 = (float)local_4f8;
  local_4f8._4_4_ = SUB84(uVar3,4);
  local_59c = local_4f8._4_4_;
  local_340 = &local_5ac;
  local_348 = &local_508;
  local_5a8 = local_508._4_4_;
  local_330 = &local_5b8;
  local_338 = &local_558;
  local_558._0_4_ = (float)local_4a8;
  local_5b8 = (float)local_558;
  local_558._4_4_ = (undefined4)((ulong)local_4a8 >> 0x20);
  local_5b4 = local_558._4_4_;
  uStack_550._0_4_ = (undefined4)uStack_4a0;
  local_5b0 = (undefined4)uStack_550;
  local_308 = &local_588;
  local_310 = &local_594;
  local_318 = &local_5a0;
  local_320 = &local_5ac;
  local_328 = &local_5b8;
  local_588.field_0.x = local_248;
  local_28 = &local_57c;
  local_57c.field_0.x = (float)local_4f8;
  local_38 = local_570;
  local_8 = &local_564;
  local_564.field_0.x = (float)local_558;
  local_468 = &local_4d8;
  local_3b0 = local_438;
  local_3a0 = local_410;
  local_380 = &local_4d8;
  local_370 = local_408;
  local_300 = &local_4d8;
  local_2f0 = local_408;
  local_2e8 = local_438;
  local_2d8 = local_410;
  local_2d0 = local_3e0;
  local_2b4 = local_374;
  local_2b0 = local_2f8;
  local_2a4 = local_3a4;
  local_2a0 = local_2e0;
  local_294 = local_3d4;
  local_1f0 = local_410;
  local_1d0 = local_408;
  local_1b0 = local_400;
  local_170 = local_430;
  local_168 = local_3d4;
  fStack_164 = local_3d4;
  fStack_160 = local_3d4;
  fStack_15c = local_3d4;
  local_158 = local_3d4;
  local_148 = local_3a4;
  fStack_144 = local_3a4;
  fStack_140 = local_3a4;
  fStack_13c = local_3a4;
  local_12c = local_3a4;
  local_128 = local_374;
  fStack_124 = local_374;
  fStack_120 = local_374;
  fStack_11c = local_374;
  local_10c = local_374;
  local_108 = local_448;
  uStack_100 = uStack_440;
  local_a8 = local_448;
  uStack_a0 = uStack_440;
  local_88 = local_448;
  uStack_80 = uStack_440;
  local_60 = local_320;
  local_58 = local_318;
  local_50 = local_310;
  local_48 = local_308;
  local_40 = local_320;
  local_30 = local_318;
  local_20 = local_310;
  local_18 = local_308;
  local_10 = local_328;
  local_5ac = local_1a8;
  local_558 = uVar1;
  uStack_550 = uVar2;
  local_548 = local_d8;
  uStack_540 = uStack_d0;
  local_538 = local_f8;
  uStack_530 = uStack_f0;
  local_528 = local_e8;
  uStack_520 = uStack_e0;
  local_518 = local_c8;
  uStack_510 = uStack_c0;
  local_508 = CONCAT44(fStack_1a4,local_1a8);
  local_4f8 = local_188;
  uStack_4f0 = uStack_180;
  local_3f8 = local_278;
  uStack_3f0 = uStack_270;
  local_3c8 = local_258;
  uStack_3c0 = uStack_250;
  local_398 = local_238;
  uStack_390 = uStack_230;
  ISPCCamera::ISPCCamera(in_RDI,(AffineSpace3f *)&local_588.field_0);
  return in_RDI;
}

Assistant:

ISPCCamera getISPCCamera (size_t width, size_t height)
    {
      const float fovScale = 1.0f/tanf(deg2rad(0.5f*fov));
      const AffineSpace3fa local2world = camera2world();
      Vec3fa vx = local2world.l.vx;
      Vec3fa vy = -local2world.l.vy;
      Vec3fa vz = -0.5f*width*local2world.l.vx + 0.5f*height*local2world.l.vy + 0.5f*height*fovScale*local2world.l.vz;
      Vec3fa p =  local2world.p;
      return ISPCCamera(AffineSpace3f(vx,vy,vz,p));
    }